

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_cx_iface.c
# Opt level: O3

aom_codec_err_t ctrl_set_tile_columns(aom_codec_alg_priv_t_conflict *ctx,__va_list_tag *args)

{
  uint uVar1;
  aom_codec_err_t aVar2;
  uint *puVar3;
  av1_extracfg extra_cfg;
  av1_extracfg aStack_268;
  
  if ((ctx->extra_cfg).auto_tiles == 0) {
    memcpy(&aStack_268,&ctx->extra_cfg,600);
    uVar1 = args->gp_offset;
    if ((ulong)uVar1 < 0x29) {
      puVar3 = (uint *)((ulong)uVar1 + (long)args->reg_save_area);
      args->gp_offset = uVar1 + 8;
    }
    else {
      puVar3 = (uint *)args->overflow_arg_area;
      args->overflow_arg_area = puVar3 + 2;
    }
    aVar2 = AOM_CODEC_OK;
    if (*puVar3 != aStack_268.tile_columns) {
      aStack_268.tile_columns = *puVar3;
      aVar2 = update_extra_cfg(ctx,&aStack_268);
    }
  }
  else {
    (ctx->base).err_detail = "AUTO_TILES is set so AV1E_SET_TILE_COLUMNS should not be called.";
    aVar2 = AOM_CODEC_INVALID_PARAM;
  }
  return aVar2;
}

Assistant:

static aom_codec_err_t ctrl_set_tile_columns(aom_codec_alg_priv_t *ctx,
                                             va_list args) {
  // If the control AUTO_TILES is used (set to 1) then don't override
  // the tile_columns set via the AUTO_TILES control.
  if (ctx->extra_cfg.auto_tiles) {
    ERROR("AUTO_TILES is set so AV1E_SET_TILE_COLUMNS should not be called.");
  }
  struct av1_extracfg extra_cfg = ctx->extra_cfg;
  unsigned int tile_columns = CAST(AV1E_SET_TILE_COLUMNS, args);
  if (tile_columns == extra_cfg.tile_columns) return AOM_CODEC_OK;
  extra_cfg.tile_columns = tile_columns;
  return update_extra_cfg(ctx, &extra_cfg);
}